

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroupSegmentTree::LoadSegment(RowGroupSegmentTree *this)

{
  RowGroupCollection *collection_p;
  long *plVar1;
  type pMVar2;
  RowGroup *this_00;
  long in_RSI;
  RowGroupPointer row_group_pointer;
  BinaryDeserializer deserializer;
  RowGroupPointer local_338;
  RowGroupPointer local_2f8;
  BinaryDeserializer local_2b8;
  
  if (*(ulong *)(in_RSI + 0x58) < *(ulong *)(in_RSI + 0x60)) {
    pMVar2 = unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>,_true>::
             operator*((unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>,_true>
                        *)(in_RSI + 0x68));
    local_2b8.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_024398b0;
    local_2b8.super_Deserializer.deserialize_enum_from_string = false;
    SerializationData::SerializationData(&local_2b8.super_Deserializer.data);
    local_2b8.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_0244e1d0;
    local_2b8.nesting_level = 0;
    local_2b8.has_buffered_field = false;
    local_2b8.buffered_field = 0;
    local_2b8.super_Deserializer.deserialize_enum_from_string = false;
    local_2b8.stream = &pMVar2->super_ReadStream;
    BinaryDeserializer::OnObjectBegin(&local_2b8);
    RowGroup::Deserialize(&local_338,&local_2b8.super_Deserializer);
    BinaryDeserializer::OnObjectEnd(&local_2b8);
    *(long *)(in_RSI + 0x58) = *(long *)(in_RSI + 0x58) + 1;
    collection_p = *(RowGroupCollection **)(in_RSI + 0x50);
    this_00 = (RowGroup *)operator_new(200);
    local_2f8.row_start = local_338.row_start;
    local_2f8.tuple_count = local_338.tuple_count;
    local_2f8.data_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_338.data_pointers.
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_2f8.data_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_338.data_pointers.
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_2f8.data_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_338.data_pointers.
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_338.data_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.data_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.data_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8.deletes_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_338.deletes_pointers.
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_2f8.deletes_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_338.deletes_pointers.
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_2f8.deletes_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_338.deletes_pointers.
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_338.deletes_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.deletes_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.deletes_pointers.
    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RowGroup::RowGroup(this_00,collection_p,&local_2f8);
    (this->super_SegmentTree<duckdb::RowGroup,_true>)._vptr_SegmentTree = (_func_int **)this_00;
    if (local_2f8.deletes_pointers.
        super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f8.deletes_pointers.
                      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      .
                      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2f8.data_pointers.
        super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f8.data_pointers.
                      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      .
                      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_338.deletes_pointers.
        super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.deletes_pointers.
                      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      .
                      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_338.data_pointers.
        super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.data_pointers.
                      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      .
                      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    Deserializer::~Deserializer(&local_2b8.super_Deserializer);
  }
  else {
    plVar1 = *(long **)(in_RSI + 0x68);
    *(undefined8 *)(in_RSI + 0x68) = 0;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
    LOCK();
    *(undefined1 *)(in_RSI + 8) = 1;
    UNLOCK();
    (this->super_SegmentTree<duckdb::RowGroup,_true>)._vptr_SegmentTree = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)this;
}

Assistant:

unique_ptr<RowGroup> RowGroupSegmentTree::LoadSegment() {
	if (current_row_group >= max_row_group) {
		reader.reset();
		finished_loading = true;
		return nullptr;
	}
	BinaryDeserializer deserializer(*reader);
	deserializer.Begin();
	auto row_group_pointer = RowGroup::Deserialize(deserializer);
	deserializer.End();
	current_row_group++;
	return make_uniq<RowGroup>(collection, std::move(row_group_pointer));
}